

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CreateSurrogatePairAtom
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,char16 lower,char16 upper)

{
  undefined1 *puVar1;
  MatchLiteralNode *deferredLiteralNode;
  long lVar2;
  undefined1 local_c0 [8];
  MatchCharNode lowerNode;
  MatchCharNode upperNode;
  
  deferredLiteralNode =
       (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
  (deferredLiteralNode->super_Node).tag = MatchLiteral;
  (deferredLiteralNode->super_Node).features = 0;
  puVar1 = &(deferredLiteralNode->super_Node).field_0xc;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
  (deferredLiteralNode->super_Node).firstSet = (CharSet<char16_t> *)0x0;
  (deferredLiteralNode->super_Node).followSet = (CharSet<char16_t> *)0x0;
  (deferredLiteralNode->super_Node).prevConsumes.lower = 0;
  *(undefined8 *)&(deferredLiteralNode->super_Node).prevConsumes.upper = 0xffffffff;
  *(undefined8 *)&(deferredLiteralNode->super_Node).thisConsumes.upper = 0xffffffff;
  (deferredLiteralNode->super_Node).followConsumes.upper = 0xffffffff;
  (deferredLiteralNode->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01558e10;
  deferredLiteralNode->isEquivClass = false;
  deferredLiteralNode->offset = 0;
  deferredLiteralNode->length = 0;
  lowerNode.super_Node._vptr_Node._0_4_ = 5;
  lowerNode.super_Node._vptr_Node._4_4_ = lowerNode.super_Node._vptr_Node._4_4_ & 0xffff8000;
  lowerNode.super_Node.tag = Empty;
  lowerNode.super_Node.features = 0;
  lowerNode.super_Node._12_4_ = 0;
  lowerNode.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  lowerNode.super_Node.followSet._0_4_ = 0;
  lowerNode.super_Node._28_8_ = 0xffffffff;
  lowerNode.super_Node.prevConsumes.upper = 0xffffffff;
  lowerNode.super_Node.thisConsumes.lower = 0;
  lowerNode.super_Node.thisConsumes.upper = 0xffffffff;
  local_c0 = (undefined1  [8])&PTR_LiteralLength_01558ef0;
  lowerNode.cs[0]._0_1_ = 0;
  lVar2 = 0x1d;
  do {
    lowerNode.cs[lVar2 + -0x20] = lower;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  lowerNode._64_8_ = &PTR_LiteralLength_01558ef0;
  lVar2 = 0x1d;
  do {
    lowerNode.cs[lVar2 + 4] = upper;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  lowerNode.super_Node.followConsumes.lower._0_2_ = lower;
  AccumLiteral(this,deferredLiteralNode,(Node *)local_c0);
  AccumLiteral(this,deferredLiteralNode,(Node *)&lowerNode.isEquivClass);
  return &deferredLiteralNode->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CreateSurrogatePairAtom(char16 lower, char16 upper)
    {
        MatchLiteralNode * literalNode = Anew(this->ctAllocator, MatchLiteralNode, 0, 0);
        MatchCharNode lowerNode(lower);
        MatchCharNode upperNode(upper);
        AccumLiteral(literalNode, &lowerNode);
        AccumLiteral(literalNode, &upperNode);

        return literalNode;
    }